

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::ElementRootU(ByteCodeWriter *this,OpCode op,PropertyIdIndexType index)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  OpLayoutType local_1c;
  PropertyIdIndexType PStack_18;
  bool success;
  OpCode local_12;
  PropertyIdIndexType index_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  PStack_18 = index;
  local_12 = op;
  _index_local = this;
  CheckOpen(this);
  op_00 = local_12;
  OpLayoutType::OpLayoutType(&local_1c,ElementRootU);
  CheckOp(this,op_00,local_1c);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(local_12);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x753,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = TryWriteElementRootU<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,local_12,PStack_18);
  if (((!bVar2) &&
      (bVar2 = TryWriteElementRootU<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,local_12,PStack_18), !bVar2)) &&
     (bVar2 = TryWriteElementRootU<Js::LayoutSizePolicy<(Js::LayoutSize)2>>(this,local_12,PStack_18)
     , !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x755,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::ElementRootU(OpCode op, PropertyIdIndexType index)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementRootU);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        MULTISIZE_LAYOUT_WRITE(ElementRootU, op, index);
    }